

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptMemoryDumper.cpp
# Opt level: O1

void __thiscall
ScriptMemoryDumper::
DumpHeapBucket<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
          (ScriptMemoryDumper *this,uint index,
          HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
          *heapBucket)

{
  SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
  *pSVar1;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *heapBlock_1;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *pSVar2;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *heapBlock;
  
  pSVar1 = &heapBucket->allocatorHead;
  do {
    DumpSmallHeapBlock<SmallAllocationBlockAttributes>
              (this,(SmallHeapBlockT<SmallAllocationBlockAttributes> *)pSVar1->heapBlock);
    pSVar1 = pSVar1->next;
  } while (pSVar1 != &heapBucket->allocatorHead);
  for (pSVar2 = heapBucket->fullBlockList;
      pSVar2 != (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      pSVar2 = (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)
               (pSVar2->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
               super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next) {
    DumpSmallHeapBlock<SmallAllocationBlockAttributes>
              (this,(SmallHeapBlockT<SmallAllocationBlockAttributes> *)pSVar2);
  }
  for (pSVar2 = heapBucket->heapBlockList;
      pSVar2 != (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
      pSVar2 = (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)
               (pSVar2->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
               super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next) {
    DumpSmallHeapBlock<SmallAllocationBlockAttributes>
              (this,(SmallHeapBlockT<SmallAllocationBlockAttributes> *)pSVar2);
  }
  return;
}

Assistant:

void ScriptMemoryDumper::DumpHeapBucket(uint index, HeapBucketT<TBlockType>* heapBucket)
{
    SmallHeapBlockAllocator<TBlockType> * currentAllocator = heapBucket->GetAllocator();
    do
    {
        DumpSmallHeapBlock(currentAllocator->GetHeapBlock());
        currentAllocator = currentAllocator->GetNext();
    }
    while (currentAllocator != heapBucket->GetAllocator());

    DumpSmallHeapBlockList(heapBucket->fullBlockList);
    DumpSmallHeapBlockList(heapBucket->heapBlockList);
}